

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void AddWindowToSortBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  int *piVar1;
  uint uVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *window_00;
  int iVar4;
  ImGuiWindow **__dest;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  iVar4 = out_sorted_windows->Size;
  if (iVar4 == out_sorted_windows->Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar6 << 3,GImAllocatorUserData);
    if (out_sorted_windows->Data != (ImGuiWindow **)0x0) {
      memcpy(__dest,out_sorted_windows->Data,(long)out_sorted_windows->Size << 3);
      ppIVar3 = out_sorted_windows->Data;
      if ((ppIVar3 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
    }
    out_sorted_windows->Data = __dest;
    out_sorted_windows->Capacity = iVar6;
    iVar4 = out_sorted_windows->Size;
  }
  else {
    __dest = out_sorted_windows->Data;
  }
  __dest[iVar4] = window;
  out_sorted_windows->Size = out_sorted_windows->Size + 1;
  if (window->Active == true) {
    uVar2 = (window->DC).ChildWindows.Size;
    if ((int)uVar2 < 2) {
      if (uVar2 != 1) {
        return;
      }
    }
    else {
      qsort((window->DC).ChildWindows.Data,(ulong)uVar2,8,ChildWindowComparer);
    }
    uVar7 = 0;
    do {
      if ((long)(window->DC).ChildWindows.Size <= (long)uVar7) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                      ,0x52e,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window_00 = (window->DC).ChildWindows.Data[uVar7];
      if (window_00->Active == true) {
        AddWindowToSortBuffer(out_sorted_windows,window_00);
      }
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  return;
}

Assistant:

static void AddWindowToSortBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            ImQsort(window->DC.ChildWindows.Data, (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortBuffer(out_sorted_windows, child);
        }
    }
}